

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomConnection::write(DomConnection *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  QAnyStringView *str_00;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_fffffffffffffe48;
  DomConnectionHints *this_00;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffe50;
  QString *in_stack_fffffffffffffe58;
  QAnyStringView *str_01;
  QAnyStringView *in_stack_fffffffffffffe60;
  QAnyStringView *in_stack_fffffffffffffe68;
  undefined1 local_140 [24];
  size_t local_128;
  QAnyStringView *local_100;
  size_t local_f0;
  QAnyStringView *local_c8;
  size_t local_b8;
  QAnyStringView *local_90;
  size_t local_80;
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  str_00 = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1c4719);
  if (bVar1) {
    __n = 10;
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"connection",10);
    QString::QString((QString *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  else {
    QString::toLower((QString *)in_stack_fffffffffffffe48);
  }
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1c47cc);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe50);
  }
  if ((this->m_children & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe68,(size_t)in_stack_fffffffffffffe60);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_58);
    QString::~QString((QString *)0x1c487a);
    __n = local_80;
  }
  if ((this->m_children & 2) != 0) {
    in_stack_fffffffffffffe68 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)str_00,(size_t)in_stack_fffffffffffffe60);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)in_stack_fffffffffffffe68,local_90);
    QString::~QString((QString *)0x1c4912);
    __n = local_b8;
  }
  if ((this->m_children & 4) != 0) {
    in_stack_fffffffffffffe60 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe68,(size_t)str_00);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)in_stack_fffffffffffffe60,local_c8);
    QString::~QString((QString *)0x1c49aa);
    __n = local_f0;
  }
  if ((this->m_children & 8) != 0) {
    str_01 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe68,(size_t)in_stack_fffffffffffffe60);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe60,(QString *)str_01);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe60,(QString *)str_01);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_01,local_100);
    QString::~QString((QString *)0x1c4a42);
    __n = local_128;
  }
  if ((this->m_children & 0x10) != 0) {
    this_00 = this->m_hints;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe68,(size_t)in_stack_fffffffffffffe60);
    DomConnectionHints::write(this_00,(int)str_00,local_140,__n);
    QString::~QString((QString *)0x1c4a9b);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomConnection::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("connection") : tagName.toLower());

    if (m_children & Sender)
        writer.writeTextElement(u"sender"_s, m_sender);

    if (m_children & Signal)
        writer.writeTextElement(u"signal"_s, m_signal);

    if (m_children & Receiver)
        writer.writeTextElement(u"receiver"_s, m_receiver);

    if (m_children & Slot)
        writer.writeTextElement(u"slot"_s, m_slot);

    if (m_children & Hints)
        m_hints->write(writer, u"hints"_s);

    writer.writeEndElement();
}